

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrDumpBoxBlif(FILE *pFile,Vec_Ptr_t *vBox)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int local_24;
  int i;
  char *pName;
  Vec_Ptr_t *vBox_local;
  FILE *pFile_local;
  
  fprintf((FILE *)pFile,".subckt");
  pvVar2 = Vec_PtrEntry(vBox,0);
  fprintf((FILE *)pFile," %s",pvVar2);
  for (local_24 = 2; iVar1 = Vec_PtrSize(vBox), local_24 < iVar1; local_24 = local_24 + 2) {
    pvVar2 = Vec_PtrEntry(vBox,local_24);
    pvVar3 = Vec_PtrEntry(vBox,local_24 + 1);
    fprintf((FILE *)pFile," %s=%s",pvVar2,pvVar3);
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Bac_PtrDumpBoxBlif( FILE * pFile, Vec_Ptr_t * vBox )
{
    char * pName; int i;
    fprintf( pFile, ".subckt" );
    fprintf( pFile, " %s", (char *)Vec_PtrEntry(vBox, 0) );
    //fprintf( pFile, " %s", (char *)Vec_PtrEntry(vBox, 1) ); // do not write intance name in BLIF
    Vec_PtrForEachEntryStart( char *, vBox, pName, i, 2 )
        fprintf( pFile, " %s=%s", pName, (char *)Vec_PtrEntry(vBox, i+1) ), i++;
    fprintf( pFile, "\n" );
}